

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressRange
          (LineTable *this,SectionedAddress Address,uint64_t Size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Result)

{
  SectionedAddress Address_00;
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Result_local;
  uint64_t Size_local;
  LineTable *this_local;
  SectionedAddress Address_local;
  
  bVar1 = lookupAddressRangeImpl(this,Address,Size,Result);
  if (bVar1) {
    Address_local.SectionIndex._7_1_ = true;
  }
  else if (Address.SectionIndex == 0xffffffffffffffff) {
    Address_local.SectionIndex._7_1_ = false;
  }
  else {
    Address_00.SectionIndex = 0xffffffffffffffff;
    Address_00.Address = Address.Address;
    Address_local.SectionIndex._7_1_ = lookupAddressRangeImpl(this,Address_00,Size,Result);
  }
  return Address_local.SectionIndex._7_1_;
}

Assistant:

bool DWARFDebugLine::LineTable::lookupAddressRange(
    object::SectionedAddress Address, uint64_t Size,
    std::vector<uint32_t> &Result) const {

  // Search for relocatable addresses
  if (lookupAddressRangeImpl(Address, Size, Result))
    return true;

  if (Address.SectionIndex == object::SectionedAddress::UndefSection)
    return false;

  // Search for absolute addresses
  Address.SectionIndex = object::SectionedAddress::UndefSection;
  return lookupAddressRangeImpl(Address, Size, Result);
}